

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O2

BOOL Js::JavascriptOperators::Equal_Full(Var aLeft,Var aRight,ScriptContext *requestContext)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  int iVar4;
  RecyclableObject *pRVar5;
  undefined4 *puVar6;
  uint lineNumber;
  double dVar7;
  double local_30;
  uint local_24 [2];
  BOOL result;
  
  if (aLeft == aRight) {
    if ((ulong)aLeft >> 0x32 != 0) {
      dVar7 = JavascriptNumber::GetValue(aLeft);
      BVar3 = JavascriptNumber::IsNan(dVar7);
      if (BVar3 != 0) {
        return 0;
      }
    }
    return 1;
  }
  local_24[0] = 0;
  bVar2 = TaggedInt::Is(aLeft);
  if (bVar2) {
    bVar2 = TaggedInt::Is(aRight);
    if (bVar2) {
      return 0;
    }
    if ((ulong)aRight >> 0x32 == 0) {
      pRVar5 = UnsafeVarTo<Js::RecyclableObject>(aRight);
      iVar4 = (*(pRVar5->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x2e])(pRVar5,aLeft,local_24,requestContext);
      if (iVar4 != 0) {
        return local_24[0];
      }
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      lineNumber = 0x240;
LAB_0099662e:
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                  ,lineNumber,"(res)","Should have handled this");
      if (bVar2) {
        *puVar6 = 0;
        return local_24[0];
      }
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    local_30 = (double)(int)aLeft;
    aLeft = aRight;
  }
  else {
    if ((ulong)aLeft >> 0x32 == 0) {
      pRVar5 = UnsafeVarTo<Js::RecyclableObject>(aLeft);
      iVar4 = (*(pRVar5->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x2e])(pRVar5,aRight,local_24,requestContext);
      if (iVar4 != 0) {
        return local_24[0];
      }
      return 0;
    }
    bVar2 = TaggedInt::Is(aRight);
    if (bVar2) {
      local_30 = (double)(int)aRight;
    }
    else {
      if (aRight < (Var)0x4000000000000) {
        pRVar5 = UnsafeVarTo<Js::RecyclableObject>(aRight);
        iVar4 = (*(pRVar5->super_FinalizableObject).super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject[0x2e])(pRVar5,aLeft,local_24,requestContext);
        if (iVar4 != 0) {
          return local_24[0];
        }
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar6 = 1;
        lineNumber = 0x251;
        goto LAB_0099662e;
      }
      local_30 = JavascriptNumber::GetValue(aLeft);
      aLeft = aRight;
    }
  }
  dVar7 = JavascriptNumber::GetValue(aLeft);
  return -(uint)(dVar7 == local_30) & 1;
}

Assistant:

BOOL JavascriptOperators::Equal_Full(Var aLeft, Var aRight, ScriptContext* requestContext)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_Equal_Full);
        //
        // Fast-path SmInts and paired Number combinations.
        //

        if (aLeft == aRight)
        {
            if (JavascriptNumber::Is(aLeft) && JavascriptNumber::IsNan(JavascriptNumber::GetValue(aLeft)))
            {
                return false;
            }
            else
            {
                return true;
            }
        }

        BOOL result = false;

        if (TaggedInt::Is(aLeft))
        {
            if (TaggedInt::Is(aRight))
            {
                // If aLeft == aRight, we would already have returned true above.
                return false;
            }
            else if (JavascriptNumber::Is_NoTaggedIntCheck(aRight))
            {
                return TaggedInt::ToDouble(aLeft) == JavascriptNumber::GetValue(aRight);
            }
            else
            {
                BOOL res = UnsafeVarTo<RecyclableObject>(aRight)->Equals(aLeft, &result, requestContext);
                AssertMsg(res, "Should have handled this");
                return result;
            }
        }
        else if (JavascriptNumber::Is_NoTaggedIntCheck(aLeft))
        {
            if (TaggedInt::Is(aRight))
            {
                return TaggedInt::ToDouble(aRight) == JavascriptNumber::GetValue(aLeft);
            }
            else if(JavascriptNumber::Is_NoTaggedIntCheck(aRight))
            {
                return JavascriptNumber::GetValue(aLeft) == JavascriptNumber::GetValue(aRight);
            }
            else
            {
                BOOL res = UnsafeVarTo<RecyclableObject>(aRight)->Equals(aLeft, &result, requestContext);
                AssertMsg(res, "Should have handled this");
                return result;
            }
        }

        if (UnsafeVarTo<RecyclableObject>(aLeft)->Equals(aRight, &result, requestContext))
        {
            return result;
        }
        else
        {
            return false;
        }
        JIT_HELPER_END(Op_Equal_Full);
    }